

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O0

void __thiscall
google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::InnerMap::
iterator_base<const_google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::KeyValuePair>
::SearchFrom(iterator_base<const_google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::KeyValuePair>
             *this,size_type start_bucket)

{
  bool bVar1;
  reference ppMVar2;
  Node *pNVar3;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  Tree *tree;
  set<google::protobuf::MapKey_*,_google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::InnerMap::KeyCompare,_google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::MapAllocator<google::protobuf::MapKey_*>_>
  *in_stack_ffffffffffffff28;
  InnerMap *in_stack_ffffffffffffff30;
  
  *in_RDI = 0;
  in_RDI[2] = in_RSI;
  while( true ) {
    if (*(ulong *)(in_RDI[1] + 8) <= (ulong)in_RDI[2]) {
      return;
    }
    bVar1 = TableEntryIsNonEmptyList(in_stack_ffffffffffffff30,(size_type)in_stack_ffffffffffffff28)
    ;
    if (bVar1) break;
    bVar1 = TableEntryIsTree(in_stack_ffffffffffffff30,(size_type)in_stack_ffffffffffffff28);
    if (bVar1) {
      std::
      set<google::protobuf::MapKey_*,_google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::InnerMap::KeyCompare,_google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::MapAllocator<google::protobuf::MapKey_*>_>
      ::begin(in_stack_ffffffffffffff28);
      ppMVar2 = std::_Rb_tree_const_iterator<google::protobuf::MapKey_*>::operator*
                          ((_Rb_tree_const_iterator<google::protobuf::MapKey_*> *)
                           in_stack_ffffffffffffff30);
      pNVar3 = NodePtrFromKeyPtr(*ppMVar2);
      *in_RDI = pNVar3;
      return;
    }
    in_RDI[2] = in_RDI[2] + 1;
  }
  *in_RDI = *(undefined8 *)(*(long *)(in_RDI[1] + 0x20) + in_RDI[2] * 8);
  return;
}

Assistant:

void SearchFrom(size_type start_bucket) {
        GOOGLE_DCHECK(m_->index_of_first_non_null_ == m_->num_buckets_ ||
               m_->table_[m_->index_of_first_non_null_] != NULL);
        node_ = NULL;
        for (bucket_index_ = start_bucket; bucket_index_ < m_->num_buckets_;
             bucket_index_++) {
          if (m_->TableEntryIsNonEmptyList(bucket_index_)) {
            node_ = static_cast<Node*>(m_->table_[bucket_index_]);
            break;
          } else if (m_->TableEntryIsTree(bucket_index_)) {
            Tree* tree = static_cast<Tree*>(m_->table_[bucket_index_]);
            GOOGLE_DCHECK(!tree->empty());
            node_ = NodePtrFromKeyPtr(*tree->begin());
            break;
          }
        }
      }